

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O0

int ffgcxui(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG nrows,long input_first_bit,
           int input_nbits,unsigned_short *array,int *status)

{
  int iVar1;
  int *anynul;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  int *in_RDI;
  long in_R8;
  uint in_R9D;
  long in_stack_00000008;
  int *in_stack_00000010;
  fitsfile *in_stack_00000018;
  char message [81];
  tcolumn *colptr;
  unsigned_short colbyte [5];
  int lshift;
  int rshift;
  int nbytes;
  int lastbyte;
  int firstbyte;
  int endbit;
  int numbits;
  int startbit;
  int bytenum;
  int nbits;
  int firstbit;
  int ii;
  uint local_dc;
  char local_d8 [22];
  unsigned_short in_stack_ffffffffffffff3e;
  LONGLONG in_stack_ffffffffffffff40;
  LONGLONG in_stack_ffffffffffffff48;
  LONGLONG in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  fitsfile *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  uint local_40;
  int local_3c;
  int local_38;
  int local_4;
  
  if ((*in_stack_00000010 < 1) && (in_RCX != 0)) {
    if (in_RDX < 1) {
      snprintf(local_d8,0x51,"Starting row number is less than 1: %ld (ffgcxui)",in_RDX);
      ffpmsg((char *)0x19ce39);
      *in_stack_00000010 = 0x133;
      local_4 = 0x133;
    }
    else if (in_R8 < 1) {
      snprintf(local_d8,0x51,"Starting bit number is less than 1: %ld (ffgcxui)",in_R8);
      ffpmsg((char *)0x19ce8c);
      *in_stack_00000010 = 0x134;
      local_4 = 0x134;
    }
    else if ((int)in_R9D < 0x11) {
      if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
           (iVar1 = ffrdef(in_stack_00000018,in_stack_00000010), 0 < iVar1)) {
          return *in_stack_00000010;
        }
      }
      else {
        ffmahd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70);
      }
      if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 2) {
        if (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < (int)in_ESI) {
          snprintf(local_d8,0x51,"Specified column number is out of range: %d (ffgcxui)",
                   (ulong)in_ESI);
          ffpmsg((char *)0x19d00c);
          snprintf(local_d8,0x51,"  There are %d columns in this table.",
                   (ulong)*(uint *)(*(long *)(in_RDI + 2) + 0x3b0));
          ffpmsg((char *)0x19d040);
          *in_stack_00000010 = 0x12e;
          local_4 = 0x12e;
        }
        else {
          anynul = (int *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(int)(in_ESI - 1) * 0xa0
                          );
          iVar1 = anynul[0x14];
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          if (iVar1 < 0xc) {
            if ((anynul[0x14] == 1) && (*(long *)(anynul + 0x16) < in_R8 + (int)in_R9D + -1)) {
              ffpmsg((char *)0x19d185);
              *in_stack_00000010 = 0x134;
              local_4 = 0x134;
            }
            else if ((anynul[0x14] == 0xb) &&
                    (*(long *)(anynul + 0x16) < (long)((int)((in_R8 + (int)in_R9D + -2) / 8) + 1)))
            {
              ffpmsg((char *)0x19d1d3);
              *in_stack_00000010 = 0x134;
              local_4 = 0x134;
            }
            else {
              for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
                iVar1 = ffgcvui(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                                in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                                in_stack_ffffffffffffff40,in_stack_ffffffffffffff3e,
                                (unsigned_short *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),anynul
                                ,in_stack_ffffffffffffff90);
                if (0 < iVar1) {
                  ffpmsg((char *)0x19d284);
                  return *in_stack_00000010;
                }
                local_3c = (int)((in_R8 + -1) % 8);
                *(undefined2 *)(in_stack_00000008 + (long)local_38 * 2) = 0;
                for (local_40 = in_R9D; local_40 != 0; local_40 = local_40 - local_dc) {
                  iVar1 = local_3c % 8;
                  if ((int)local_40 < 8 - iVar1) {
                    local_dc = local_40;
                  }
                  else {
                    local_dc = 8 - iVar1;
                  }
                  *(ushort *)(in_stack_00000008 + (long)local_38 * 2) =
                       (ushort)(((int)(uint)*(ushort *)
                                             (&stack0xffffffffffffff92 + (long)(local_3c / 8) * 2)
                                >> (7U - ((char)iVar1 + (char)local_dc + -1) & 0x1f)) <<
                               ((char)local_40 - (char)local_dc & 0x1fU)) |
                       *(ushort *)(in_stack_00000008 + (long)local_38 * 2);
                  local_3c = local_dc + local_3c;
                }
              }
              local_4 = *in_stack_00000010;
            }
          }
          else {
            ffpmsg((char *)0x19d0c3);
            *in_stack_00000010 = 0x136;
            local_4 = 0x136;
          }
        }
      }
      else {
        ffpmsg((char *)0x19cfaa);
        *in_stack_00000010 = 0xe3;
        local_4 = 0xe3;
      }
    }
    else {
      snprintf(local_d8,0x51,"Number of bits to read is > 16: %d (ffgcxui)",(ulong)in_R9D);
      ffpmsg((char *)0x19cedd);
      *in_stack_00000010 = 0x134;
      local_4 = 0x134;
    }
  }
  else {
    local_4 = *in_stack_00000010;
  }
  return local_4;
}

Assistant:

int ffgcxui(fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG  nrows,      /* I - no. of rows to read                     */
            long  input_first_bit, /* I - first bit to read (1 = 1st)        */
            int   input_nbits,     /* I - number of bits to read (<= 32)     */
            unsigned short *array, /* O - array of integer values            */
            int  *status)     /* IO - error status                           */
/*
  Read a consecutive string of bits from an 'X' or 'B' column and
  interprete them as an unsigned integer.  The number of bits must be
  less than or equal to 16 or the total number of bits in the column, 
  which ever is less.
*/
{
    int ii, firstbit, nbits, bytenum, startbit, numbits, endbit;
    int firstbyte, lastbyte, nbytes, rshift, lshift;
    unsigned short colbyte[5];
    tcolumn *colptr;
    char message[FLEN_ERRMSG];

    if (*status > 0 || nrows == 0)
        return(*status);

    /*  check input parameters */
    if (firstrow < 1)
    {
          snprintf(message,FLEN_ERRMSG, "Starting row number is less than 1: %ld (ffgcxui)",
                (long) firstrow);
          ffpmsg(message);
          return(*status = BAD_ROW_NUM);
    }
    else if (input_first_bit < 1)
    {
          snprintf(message,FLEN_ERRMSG, "Starting bit number is less than 1: %ld (ffgcxui)",
                input_first_bit);
          ffpmsg(message);
          return(*status = BAD_ELEM_NUM);
    }
    else if (input_nbits > 16)
    {
          snprintf(message, FLEN_ERRMSG,"Number of bits to read is > 16: %d (ffgcxui)",
                input_nbits);
          ffpmsg(message);
          return(*status = BAD_ELEM_NUM);
    }

    /* position to the correct HDU */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype != BINARY_TBL)
    {
        ffpmsg("This is not a binary table extension (ffgcxui)");
        return(*status = NOT_BTABLE);
    }

    if (colnum > (fptr->Fptr)->tfield)
    {
      snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d (ffgcxui)",
                colnum);
        ffpmsg(message);
        snprintf(message, FLEN_ERRMSG,"  There are %d columns in this table.",
                (fptr->Fptr)->tfield );
        ffpmsg(message);

        return(*status = BAD_COL_NUM);
    }       

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    if (abs(colptr->tdatatype) > TBYTE)
    {
        ffpmsg("Can only read bits from X or B type columns. (ffgcxui)");
        return(*status = NOT_LOGICAL_COL); /* not correct datatype column */
    }

    firstbyte = (input_first_bit - 1              ) / 8 + 1;
    lastbyte  = (input_first_bit + input_nbits - 2) / 8 + 1;
    nbytes = lastbyte - firstbyte + 1;

    if (colptr->tdatatype == TBIT && 
        input_first_bit + input_nbits - 1 > (long) colptr->trepeat)
    {
        ffpmsg("Too many bits. Tried to read past width of column (ffgcxui)");
        return(*status = BAD_ELEM_NUM);
    }
    else if (colptr->tdatatype == TBYTE && lastbyte > (long) colptr->trepeat)
    {
        ffpmsg("Too many bits. Tried to read past width of column (ffgcxui)");
        return(*status = BAD_ELEM_NUM);
    }

    for (ii = 0; ii < nrows; ii++)
    {
        /* read the relevant bytes from the row */
        if (ffgcvui(fptr, colnum, firstrow+ii, firstbyte, nbytes, 0, 
               colbyte, NULL, status) > 0)
        {
             ffpmsg("Error reading bytes from column (ffgcxui)");
             return(*status);
        }

        firstbit = (input_first_bit - 1) % 8; /* modulus operator */
        nbits = input_nbits;

        array[ii] = 0;

        /* select and shift the bits from each byte into the output word */
        while(nbits)
        {
            bytenum = firstbit / 8;

            startbit = firstbit % 8;  
            numbits = minvalue(nbits, 8 - startbit);
            endbit = startbit + numbits - 1;

            rshift = 7 - endbit;
            lshift = nbits - numbits;

            array[ii] = ((colbyte[bytenum] >> rshift) << lshift) | array[ii];

            nbits -= numbits;
            firstbit += numbits;
        }
    }

    return(*status);
}